

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O0

compile_errcode __thiscall Default::Parse(Default *this)

{
  LogTools *log_tools_ptr;
  Statement *pSVar1;
  allocator local_49;
  string local_48;
  SymbolName local_24;
  int local_20;
  SymbolName name;
  int state;
  int ret;
  Default *this_local;
  
  name = WHILE_SYM;
  local_20 = 0;
  _state = this;
  do {
    local_24 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    if (local_20 == 0) {
      if (local_24 != DEFAULT_SYM) {
        return -1;
      }
      local_20 = 1;
    }
    else if (local_20 == 1) {
      if (local_24 != COLON_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_48,"expected a \':\'",&local_49);
        GrammaErrorLogs(log_tools_ptr,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        return -1;
      }
      local_20 = 2;
    }
    else if (local_20 == 2) {
      pSVar1 = (Statement *)operator_new(0x1e8);
      Statement::Statement(pSVar1);
      this->m_statement_ptr = pSVar1;
      name = (**(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface)();
      if (name == WHILE_SYM) {
        (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
        pSVar1 = this->m_statement_ptr;
        if (pSVar1 != (Statement *)0x0) {
          Statement::~Statement(pSVar1);
          operator_delete(pSVar1);
        }
        this_local._4_4_ = 0;
      }
      else {
        pSVar1 = this->m_statement_ptr;
        if (pSVar1 != (Statement *)0x0) {
          Statement::~Statement(pSVar1);
          operator_delete(pSVar1);
        }
        this_local._4_4_ = -1;
      }
      return this_local._4_4_;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode Default::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ':'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Parse()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}